

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O0

void invert_U8(uchar *U,int n)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uchar tmp_rk;
  uchar mask_prepending;
  int k;
  int k_1;
  uchar mask_rc;
  int r;
  int c;
  int n_local;
  uchar *U_local;
  
  for (c = n + -2; r = c, -1 < c; c = c + -1) {
    while (r = r + -1, -1 < r) {
      bVar2 = 7U - (char)(c % 8) & 0x1f;
      bVar2 = (char)(0 >> bVar2) - ((byte)((int)(uint)U[(r * n) / 8 + c / 8] >> bVar2) & 1);
      for (k_1 = n + -1; c + 9 <= k_1; k_1 = k_1 + -8) {
        iVar4 = r * (n / 8) + k_1 / 8;
        U[iVar4] = U[iVar4] ^ bVar2 & U[c * (n / 8) + k_1 / 8];
      }
      iVar4 = c + 1;
      bVar3 = (char)(0x100 >> ((byte)((long)iVar4 % 8) & 0x1f)) - 1;
      bVar1 = U[r * (n / 8) + iVar4 / 8];
      iVar5 = r * (n / 8) + iVar4 / 8;
      U[iVar5] = U[iVar5] ^ bVar2 & U[c * (n / 8) + iVar4 / 8];
      iVar5 = r * (n / 8) + iVar4 / 8;
      U[iVar5] = U[iVar5] & bVar3;
      iVar4 = r * (n / 8) + iVar4 / 8;
      U[iVar4] = U[iVar4] | bVar1 & (bVar3 ^ 0xff);
    }
  }
  return;
}

Assistant:

void invert_U8(unsigned char *U, int n)
{
  /*
   * inversion == backwards substitution
   *
   * For all columns c = n-1 ... 0
   *   For all rows c-1 ... 0
   *     add (row c) * (leading (c'th) element of row r) to row r.
   *       only do it for the k elements k = c+1 ... n-1
   */
  for(int c = n-2; c >= 0; c--)
  {
    /*
     * Basically:
     *      copy elements c+1 to n-1 from c'th row to r'th row iff leading element of row r is 1
     */

    for(int r = c-1; r >= 0; r--)
    {
      /*
       * first copy all "full bytes" at the right
       */
      unsigned char mask_rc = 0x00 - ((U[r*n/8 + (c/8)] >> (7 - (c % 8))) & 1); // mask for the element U(r,c)
      for(int k = n-1; k >= c+1 + 8; k -= 8)
      {
        U[r*(n/8) + k/8] ^= mask_rc & U[c*(n/8) + k/8];
      }

      /*
       * then handle the left-most "partial byte"
       */
      int k = c+1;
      unsigned char mask_prepending = (unsigned char) (0x100 >> (k % 8)) - 1;

      unsigned char tmp_rk = U[r*(n/8) + k/8] & ~mask_prepending; // store the left side of the splitted byte in tmp
      U[r*(n/8) + k/8]  ^= (mask_rc & U[c*(n/8) + k/8]);

      // restore the left bits: first set bits 0, then 'or' tmp
      U[r*(n/8) + k/8] &= mask_prepending;
      U[r*(n/8) + k/8] |= tmp_rk;
    }
  }
}